

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O2

Node * __thiscall BinarySearchTree::findMin(BinarySearchTree *this,Node *node)

{
  Node *pNVar1;
  
  do {
    pNVar1 = node;
    if (node == (Node *)0x0) {
      return pNVar1;
    }
    node = node->leftChild;
  } while (node != (Node *)0x0);
  return pNVar1;
}

Assistant:

BinarySearchTree::Node *BinarySearchTree::findMin(Node *node) {
    if (node == nullptr) {
        return nullptr;
    } else if (node->leftChild == nullptr) {
        return node;
    } else {
        return findMin(node->leftChild);
    }
}